

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomData.hpp
# Opt level: O0

void __thiscall OpenMD::AtomData::~AtomData(AtomData *this)

{
  AtomData *in_RDI;
  
  ~AtomData(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

AtomData(const std::string& id = "ATOMDATA") : GenericData(id) {}